

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

void pfx_table_for_each_rec(trie_node *n,pfx_for_each_fp fp,void *data)

{
  long lVar1;
  uint *puVar2;
  long lVar3;
  uint i;
  ulong uVar4;
  long lVar5;
  long in_FS_OFFSET;
  pfx_record pfxr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (n == (trie_node *)0x0) {
    __assert_fail("n",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20b,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (fp == (pfx_for_each_fp)0x0) {
    __assert_fail("fp",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20c,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  puVar2 = (uint *)n->data;
  if (puVar2 == (uint *)0x0) {
    __assert_fail("nd",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x20f,"void pfx_table_for_each_rec(struct trie_node *, pfx_for_each_fp, void *)")
    ;
  }
  if (n->lchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->lchild,fp,data);
  }
  lVar5 = 8;
  for (uVar4 = 0; uVar4 < *puVar2; uVar4 = uVar4 + 1) {
    lVar3 = *(long *)(puVar2 + 2);
    pfxr.asn = *(uint32_t *)(lVar3 + -8 + lVar5);
    pfxr.prefix.u.addr6.addr[3] = (n->prefix).u.addr6.addr[3];
    pfxr.prefix.ver = (n->prefix).ver;
    pfxr.prefix.u.addr4.addr = (lrtr_ipv4_addr)(n->prefix).u.addr4.addr;
    pfxr.prefix.u.addr6.addr[1] = (n->prefix).u.addr6.addr[1];
    pfxr.prefix.u.addr6.addr[2] = (n->prefix).u.addr6.addr[2];
    pfxr.min_len = n->len;
    pfxr.max_len = *(uint8_t *)(lVar3 + -4 + lVar5);
    pfxr.socket = *(rtr_socket **)(lVar3 + lVar5);
    (*fp)(&pfxr,data);
    lVar5 = lVar5 + 0x10;
  }
  if (n->rchild != (trie_node *)0x0) {
    pfx_table_for_each_rec(n->rchild,fp,data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void pfx_table_for_each_rec(struct trie_node *n, pfx_for_each_fp fp, void *data)
{
	struct pfx_record pfxr;
	struct node_data *nd;

	assert(n);
	assert(fp);

	nd = (struct node_data *)n->data;
	assert(nd);

	if (n->lchild)
		pfx_table_for_each_rec(n->lchild, fp, data);

	for (unsigned int i = 0; i < nd->len; i++) {
		pfxr.asn = nd->ary[i].asn;
		pfxr.prefix = n->prefix;
		pfxr.min_len = n->len;
		pfxr.max_len = nd->ary[i].max_len;
		pfxr.socket = nd->ary[i].socket;
		fp(&pfxr, data);
	}

	if (n->rchild)
		pfx_table_for_each_rec(n->rchild, fp, data);
}